

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

int32_t icu_63::anon_unknown_0::findSameBlock
                  (uint16_t *p,int32_t pStart,int32_t length,uint16_t *q,int32_t qStart,
                  int32_t blockLength)

{
  bool bVar1;
  long lVar2;
  uint16_t *s;
  
  lVar2 = (long)pStart;
  s = p + lVar2;
  while( true ) {
    if (length - blockLength < lVar2) {
      return -1;
    }
    bVar1 = equalBlocks(s,q + qStart,blockLength);
    if (bVar1) break;
    lVar2 = lVar2 + 1;
    s = s + 1;
  }
  return (int32_t)lVar2;
}

Assistant:

int32_t findSameBlock(const uint16_t *p, int32_t pStart, int32_t length,
                      const uint16_t *q, int32_t qStart, int32_t blockLength) {
    // Ensure that we do not even partially get past length.
    length -= blockLength;

    q += qStart;
    while (pStart <= length) {
        if (equalBlocks(p + pStart, q, blockLength)) {
            return pStart;
        }
        ++pStart;
    }
    return -1;
}